

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disco_test.cpp
# Opt level: O0

void __thiscall async_unit_test::single(async_unit_test *this)

{
  ostream *poVar1;
  void *this_00;
  uint i;
  ostream *out;
  uint local_14;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Running async test without error reporting\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  calls = calls + 1;
  cppcms::application::response();
  this_00 = (void *)cppcms::http::response::out();
  for (local_14 = 0; local_14 < 100000; local_14 = local_14 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(this_00,local_14);
    std::operator<<(poVar1,'\n');
  }
  cppcms::application::release_context();
  std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x10e651);
  cppcms::http::context::async_complete_response();
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x10e665)
  ;
  return;
}

Assistant:

void single()
	{
		std::cout << "Running async test without error reporting\n" << std::endl;
		calls ++;
		std::ostream &out = response().out();
		for(unsigned i=0;i<100000;i++) {
			out << i << '\n';
		}
		release_context()->async_complete_response();
	}